

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vardata.c
# Opt level: O1

int vardata_add_varset(vardata *data,char *name,char *description)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  vardata_varset *pvVar6;
  
  if (data->validated == 0) {
    iVar2 = symtab_put(data->symtab,name,2,data->varsetsnum);
    if (iVar2 == -1) {
      iVar2 = -1;
    }
    else {
      iVar2 = data->varsetsnum;
      pcVar4 = strdup(name);
      if (description == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = strdup(description);
      }
      iVar1 = data->varsetsmax;
      if (iVar1 <= iVar2) {
        iVar3 = 0x10;
        if (iVar1 != 0) {
          iVar3 = iVar1 * 2;
        }
        data->varsetsmax = iVar3;
        pvVar6 = (vardata_varset *)realloc(data->varsets,(long)iVar3 << 4);
        data->varsets = pvVar6;
      }
      pvVar6 = data->varsets;
      iVar1 = data->varsetsnum;
      data->varsetsnum = iVar1 + 1;
      pvVar6[iVar1].name = pcVar4;
      pvVar6[iVar1].description = pcVar5;
    }
    return iVar2;
  }
  abort();
}

Assistant:

int vardata_add_varset(struct vardata *data, const char *name, const char *description) {
	if (data->validated)
		abort();
	if (symtab_put(data->symtab, name, VARDATA_ST_VARSET, data->varsetsnum) == -1)
		return -1;
	int res = data->varsetsnum;
	struct vardata_varset new = { strdup(name) };
	if (description)
		new.description = strdup(description);
	ADDARRAY(data->varsets, new);
	return res;
}